

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct64_low32_avx2(__m256i *input,__m256i *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i _r_05;
  __m256i _r_06;
  __m256i _r_07;
  __m256i _r_08;
  __m256i _r_09;
  __m256i _r_10;
  __m256i _r_11;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  ushort uVar166;
  ushort uVar167;
  ushort uVar168;
  ushort uVar169;
  ushort uVar170;
  ushort uVar171;
  ushort uVar172;
  ushort uVar173;
  ushort uVar174;
  ushort uVar175;
  ushort uVar176;
  ushort uVar177;
  ushort uVar178;
  ushort uVar179;
  ushort uVar180;
  ushort uVar181;
  ushort uVar182;
  ushort uVar183;
  ushort uVar184;
  ushort uVar185;
  ushort uVar186;
  ushort uVar187;
  ushort uVar188;
  ushort uVar189;
  ushort uVar190;
  ushort uVar191;
  ushort uVar192;
  ushort uVar193;
  ushort uVar194;
  ushort uVar195;
  ushort uVar196;
  ushort uVar197;
  ushort uVar198;
  ushort uVar199;
  ushort uVar200;
  ushort uVar201;
  ushort uVar202;
  ushort uVar203;
  ushort uVar204;
  ushort uVar205;
  ushort uVar206;
  ushort uVar207;
  ushort uVar208;
  ushort uVar209;
  ushort uVar210;
  ushort uVar211;
  ushort uVar212;
  ushort uVar213;
  ushort uVar214;
  ushort uVar215;
  ushort uVar216;
  ushort uVar217;
  ushort uVar218;
  ushort uVar219;
  ushort uVar220;
  ushort uVar221;
  ushort uVar222;
  ushort uVar223;
  ushort uVar224;
  ushort uVar225;
  ushort uVar226;
  ushort uVar227;
  uint uVar228;
  int32_t *piVar229;
  undefined8 *in_RDI;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  __m256i _in_31;
  __m256i _w1_31;
  __m256i _w0_31;
  __m256i _in_30;
  __m256i _w1_30;
  __m256i _w0_30;
  __m256i _in_29;
  __m256i _w1_29;
  __m256i _w0_29;
  __m256i _in_28;
  __m256i _w1_28;
  __m256i _w0_28;
  __m256i _in_27;
  __m256i _w1_27;
  __m256i _w0_27;
  __m256i _in_26;
  __m256i _w1_26;
  __m256i _w0_26;
  __m256i _in_25;
  __m256i _w1_25;
  __m256i _w0_25;
  __m256i _in_24;
  __m256i _w1_24;
  __m256i _w0_24;
  __m256i _in_23;
  __m256i _w1_23;
  __m256i _w0_23;
  __m256i _in_22;
  __m256i _w1_22;
  __m256i _w0_22;
  __m256i _in_21;
  __m256i _w1_21;
  __m256i _w0_21;
  __m256i _in_20;
  __m256i _w1_20;
  __m256i _w0_20;
  __m256i _in_19;
  __m256i _w1_19;
  __m256i _w0_19;
  __m256i _in_18;
  __m256i _w1_18;
  __m256i _w0_18;
  __m256i _in_17;
  __m256i _w1_17;
  __m256i _w0_17;
  __m256i _in_16;
  __m256i _w1_16;
  __m256i _w0_16;
  __m256i _in_15;
  __m256i _w1_15;
  __m256i _w0_15;
  __m256i _in_14;
  __m256i _w1_14;
  __m256i _w0_14;
  __m256i _in_13;
  __m256i _w1_13;
  __m256i _w0_13;
  __m256i _in_12;
  __m256i _w1_12;
  __m256i _w0_12;
  __m256i _in_11;
  __m256i _w1_11;
  __m256i _w0_11;
  __m256i _in_10;
  __m256i _w1_10;
  __m256i _w0_10;
  __m256i _in_9;
  __m256i _w1_9;
  __m256i _w0_9;
  __m256i _in_8;
  __m256i _w1_8;
  __m256i _w0_8;
  __m256i _in_7;
  __m256i _w1_7;
  __m256i _w0_7;
  __m256i _in_6;
  __m256i _w1_6;
  __m256i _w0_6;
  __m256i _in_5;
  __m256i _w1_5;
  __m256i _w0_5;
  __m256i _in_4;
  __m256i _w1_4;
  __m256i _w0_4;
  __m256i _in_3;
  __m256i _w1_3;
  __m256i _w0_3;
  __m256i _in_2;
  __m256i _w1_2;
  __m256i _w0_2;
  __m256i _in_1;
  __m256i _w1_1;
  __m256i _w0_1;
  __m256i _in;
  __m256i _w1;
  __m256i _w0;
  __m256i x [64];
  __m256i cospi_m32_p32;
  __m256i cospi_m48_m16;
  __m256i cospi_p48_p16;
  __m256i cospi_m16_p48;
  __m256i cospi_p32_p32;
  __m256i _r;
  int32_t *cospi;
  __m256i *in_stack_ffffffffffffc960;
  __m256i *in_stack_ffffffffffffc968;
  int16_t in_stack_ffffffffffffc970;
  int16_t in_stack_ffffffffffffc972;
  int8_t in_stack_ffffffffffffc977;
  undefined4 in_stack_ffffffffffffc978;
  undefined1 uVar234;
  int8_t cos_bit;
  undefined1 uVar235;
  int8_t cos_bit_00;
  undefined4 uVar236;
  __m256i *x_00;
  undefined8 in_stack_ffffffffffffca30;
  int8_t cos_bit_01;
  undefined8 in_stack_ffffffffffffca38;
  undefined8 in_stack_ffffffffffffca40;
  undefined8 in_stack_ffffffffffffca48;
  longlong in_stack_ffffffffffffca50;
  int32_t *in_stack_ffffffffffffca58;
  __m256i *in_stack_ffffffffffffca60;
  undefined8 in_stack_ffffffffffffcaf0;
  int8_t cos_bit_02;
  undefined8 in_stack_ffffffffffffcaf8;
  undefined8 in_stack_ffffffffffffcb00;
  undefined8 in_stack_ffffffffffffcb08;
  longlong in_stack_ffffffffffffcb10;
  int32_t *in_stack_ffffffffffffcb18;
  __m256i *in_stack_ffffffffffffcb20;
  undefined8 uVar237;
  int32_t cos_bit_03;
  undefined8 uVar238;
  longlong lVar239;
  longlong lVar240;
  longlong lVar241;
  undefined8 uVar242;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_310;
  undefined8 uStack_308;
  longlong lStack_2d0;
  undefined8 uStack_2c8;
  __m256i *palStack_298;
  __m256i *palStack_290;
  undefined8 uStack_288;
  longlong lStack_250;
  undefined8 uStack_248;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  cos_bit_01 = (int8_t)((ulong)in_stack_ffffffffffffca30 >> 0x38);
  cos_bit_02 = (int8_t)((ulong)in_stack_ffffffffffffcaf0 >> 0x38);
  piVar229 = cospi_arr(0xc);
  uVar236 = 0x800;
  auVar1 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar1 = vpinsrd_avx(auVar1,0x800,2);
  vpinsrd_avx(auVar1,0x800,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar1 = vpinsrd_avx(auVar1,0x800,2);
  vpinsrd_avx(auVar1,0x800,3);
  pair_set_w16_epi16(in_stack_ffffffffffffc972,in_stack_ffffffffffffc970);
  pair_set_w16_epi16(in_stack_ffffffffffffc972,in_stack_ffffffffffffc970);
  pair_set_w16_epi16(in_stack_ffffffffffffc972,in_stack_ffffffffffffc970);
  pair_set_w16_epi16(in_stack_ffffffffffffc972,in_stack_ffffffffffffc970);
  pair_set_w16_epi16(in_stack_ffffffffffffc972,in_stack_ffffffffffffc970);
  uVar3 = *in_RDI;
  uVar4 = in_RDI[3];
  x_00 = (__m256i *)in_RDI[0x40];
  uVar5 = in_RDI[0x43];
  uVar237 = in_RDI[0x20];
  uVar238 = in_RDI[0x23];
  uVar6 = in_RDI[0x60];
  uVar7 = in_RDI[99];
  uVar8 = in_RDI[0x10];
  uVar9 = in_RDI[0x13];
  uVar10 = in_RDI[0x50];
  uVar11 = in_RDI[0x53];
  lVar239 = in_RDI[0x30];
  uVar242 = in_RDI[0x33];
  uVar12 = in_RDI[0x70];
  uVar13 = in_RDI[0x73];
  uVar14 = in_RDI[8];
  uVar15 = in_RDI[0x48];
  uVar16 = in_RDI[0x28];
  uVar17 = in_RDI[0x68];
  uVar18 = in_RDI[0x18];
  uVar19 = in_RDI[0x58];
  uVar20 = in_RDI[0x38];
  uVar21 = in_RDI[0x78];
  uVar22 = in_RDI[4];
  uVar23 = in_RDI[0x44];
  uVar24 = in_RDI[0x24];
  uVar25 = in_RDI[100];
  uVar26 = in_RDI[0x14];
  uVar27 = in_RDI[0x54];
  uVar28 = in_RDI[0x34];
  uVar29 = in_RDI[0x74];
  uVar30 = in_RDI[0xc];
  uVar31 = in_RDI[0x4c];
  uVar32 = in_RDI[0x2c];
  uVar33 = in_RDI[0x6c];
  uVar34 = in_RDI[0x1c];
  uVar35 = in_RDI[0x5c];
  uVar36 = in_RDI[0x3c];
  uVar37 = in_RDI[0x7c];
  uVar228 = piVar229[0x3f] << 3;
  uVar166 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar166),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar166),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_1090 = auVar232._0_8_;
  uStack_1088 = auVar232._8_8_;
  uVar228 = piVar229[1] << 3;
  uVar167 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar167),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar167),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_1050 = auVar231._0_8_;
  uStack_1048 = auVar231._8_8_;
  auVar165._8_8_ = uVar22;
  auVar165._0_8_ = uVar22;
  auVar165._16_8_ = uVar22;
  auVar165._24_8_ = uVar22;
  auVar164._16_8_ = uStack_1090;
  auVar164._0_16_ = auVar1;
  auVar164._24_8_ = uStack_1088;
  vpmulhrsw_avx2(auVar165,auVar164);
  auVar163._8_8_ = uVar22;
  auVar163._0_8_ = uVar22;
  auVar163._16_8_ = uVar22;
  auVar163._24_8_ = uVar22;
  auVar162._16_8_ = uStack_1050;
  auVar162._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar162._24_8_ = uStack_1048;
  vpmulhrsw_avx2(auVar163,auVar162);
  uVar168 = (short)piVar229[0x21] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar168),(uint)uVar168,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar168,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar168,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar168,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar168,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar168,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar168,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar168),(uint)uVar168,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar168,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar168,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar168,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar168,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar168,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar168,7);
  uStack_1010 = auVar232._0_8_;
  uStack_1008 = auVar232._8_8_;
  uVar228 = piVar229[0x1f] << 3;
  uVar169 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar169),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar169),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_fd0 = auVar231._0_8_;
  uStack_fc8 = auVar231._8_8_;
  auVar161._8_8_ = uVar37;
  auVar161._0_8_ = uVar37;
  auVar161._16_8_ = uVar37;
  auVar161._24_8_ = uVar37;
  auVar160._16_8_ = uStack_1010;
  auVar160._0_16_ = auVar1;
  auVar160._24_8_ = uStack_1008;
  vpmulhrsw_avx2(auVar161,auVar160);
  auVar159._8_8_ = uVar37;
  auVar159._0_8_ = uVar37;
  auVar159._16_8_ = uVar37;
  auVar159._24_8_ = uVar37;
  auVar158._16_8_ = uStack_fd0;
  auVar158._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar158._24_8_ = uStack_fc8;
  vpmulhrsw_avx2(auVar159,auVar158);
  uVar228 = piVar229[0x2f] << 3;
  uVar170 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar170),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar170),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_f90 = auVar232._0_8_;
  uStack_f88 = auVar232._8_8_;
  uVar228 = piVar229[0x11] << 3;
  uVar171 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar171),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar171),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_f50 = auVar231._0_8_;
  uStack_f48 = auVar231._8_8_;
  auVar157._8_8_ = uVar23;
  auVar157._0_8_ = uVar23;
  auVar157._16_8_ = uVar23;
  auVar157._24_8_ = uVar23;
  auVar156._16_8_ = uStack_f90;
  auVar156._0_16_ = auVar1;
  auVar156._24_8_ = uStack_f88;
  vpmulhrsw_avx2(auVar157,auVar156);
  auVar155._8_8_ = uVar23;
  auVar155._0_8_ = uVar23;
  auVar155._16_8_ = uVar23;
  auVar155._24_8_ = uVar23;
  auVar154._16_8_ = uStack_f50;
  auVar154._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar154._24_8_ = uStack_f48;
  vpmulhrsw_avx2(auVar155,auVar154);
  uVar172 = (short)piVar229[0x31] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar172),(uint)uVar172,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar172,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar172,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar172,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar172,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar172,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar172,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar172),(uint)uVar172,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar172,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar172,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar172,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar172,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar172,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar172,7);
  uStack_f10 = auVar232._0_8_;
  uStack_f08 = auVar232._8_8_;
  uVar228 = piVar229[0xf] << 3;
  uVar173 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar173),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar173),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_ed0 = auVar231._0_8_;
  uStack_ec8 = auVar231._8_8_;
  auVar153._8_8_ = uVar36;
  auVar153._0_8_ = uVar36;
  auVar153._16_8_ = uVar36;
  auVar153._24_8_ = uVar36;
  auVar152._16_8_ = uStack_f10;
  auVar152._0_16_ = auVar1;
  auVar152._24_8_ = uStack_f08;
  vpmulhrsw_avx2(auVar153,auVar152);
  auVar151._8_8_ = uVar36;
  auVar151._0_8_ = uVar36;
  auVar151._16_8_ = uVar36;
  auVar151._24_8_ = uVar36;
  auVar150._16_8_ = uStack_ed0;
  auVar150._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar150._24_8_ = uStack_ec8;
  vpmulhrsw_avx2(auVar151,auVar150);
  uVar228 = piVar229[0x37] << 3;
  uVar174 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar174),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar174),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_e90 = auVar232._0_8_;
  uStack_e88 = auVar232._8_8_;
  uVar228 = piVar229[9] << 3;
  uVar175 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar175),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar175),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_e50 = auVar231._0_8_;
  uStack_e48 = auVar231._8_8_;
  auVar149._8_8_ = uVar24;
  auVar149._0_8_ = uVar24;
  auVar149._16_8_ = uVar24;
  auVar149._24_8_ = uVar24;
  auVar148._16_8_ = uStack_e90;
  auVar148._0_16_ = auVar1;
  auVar148._24_8_ = uStack_e88;
  vpmulhrsw_avx2(auVar149,auVar148);
  auVar147._8_8_ = uVar24;
  auVar147._0_8_ = uVar24;
  auVar147._16_8_ = uVar24;
  auVar147._24_8_ = uVar24;
  auVar146._16_8_ = uStack_e50;
  auVar146._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar146._24_8_ = uStack_e48;
  vpmulhrsw_avx2(auVar147,auVar146);
  uVar176 = (short)piVar229[0x29] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar176),(uint)uVar176,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar176,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar176,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar176,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar176,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar176,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar176,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar176),(uint)uVar176,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar176,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar176,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar176,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar176,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar176,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar176,7);
  uStack_e10 = auVar232._0_8_;
  uStack_e08 = auVar232._8_8_;
  uVar228 = piVar229[0x17] << 3;
  uVar177 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar177),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar177),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_dd0 = auVar231._0_8_;
  uStack_dc8 = auVar231._8_8_;
  auVar145._8_8_ = uVar35;
  auVar145._0_8_ = uVar35;
  auVar145._16_8_ = uVar35;
  auVar145._24_8_ = uVar35;
  auVar144._16_8_ = uStack_e10;
  auVar144._0_16_ = auVar1;
  auVar144._24_8_ = uStack_e08;
  vpmulhrsw_avx2(auVar145,auVar144);
  auVar143._8_8_ = uVar35;
  auVar143._0_8_ = uVar35;
  auVar143._16_8_ = uVar35;
  auVar143._24_8_ = uVar35;
  auVar142._16_8_ = uStack_dd0;
  auVar142._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar142._24_8_ = uStack_dc8;
  vpmulhrsw_avx2(auVar143,auVar142);
  uVar228 = piVar229[0x27] << 3;
  uVar178 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar178),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar178),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_d90 = auVar232._0_8_;
  uStack_d88 = auVar232._8_8_;
  uVar228 = piVar229[0x19] << 3;
  uVar179 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar179),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar179),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_d50 = auVar231._0_8_;
  uStack_d48 = auVar231._8_8_;
  auVar141._8_8_ = uVar25;
  auVar141._0_8_ = uVar25;
  auVar141._16_8_ = uVar25;
  auVar141._24_8_ = uVar25;
  auVar140._16_8_ = uStack_d90;
  auVar140._0_16_ = auVar1;
  auVar140._24_8_ = uStack_d88;
  vpmulhrsw_avx2(auVar141,auVar140);
  auVar139._8_8_ = uVar25;
  auVar139._0_8_ = uVar25;
  auVar139._16_8_ = uVar25;
  auVar139._24_8_ = uVar25;
  auVar138._16_8_ = uStack_d50;
  auVar138._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar138._24_8_ = uStack_d48;
  vpmulhrsw_avx2(auVar139,auVar138);
  uVar180 = (short)piVar229[0x39] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar180),(uint)uVar180,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar180,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar180,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar180,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar180,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar180,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar180,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar180),(uint)uVar180,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar180,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar180,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar180,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar180,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar180,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar180,7);
  uStack_d10 = auVar232._0_8_;
  uStack_d08 = auVar232._8_8_;
  uVar228 = piVar229[7] << 3;
  uVar181 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar181),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar181),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_cd0 = auVar231._0_8_;
  uStack_cc8 = auVar231._8_8_;
  auVar137._8_8_ = uVar34;
  auVar137._0_8_ = uVar34;
  auVar137._16_8_ = uVar34;
  auVar137._24_8_ = uVar34;
  auVar136._16_8_ = uStack_d10;
  auVar136._0_16_ = auVar1;
  auVar136._24_8_ = uStack_d08;
  vpmulhrsw_avx2(auVar137,auVar136);
  auVar135._8_8_ = uVar34;
  auVar135._0_8_ = uVar34;
  auVar135._16_8_ = uVar34;
  auVar135._24_8_ = uVar34;
  auVar134._16_8_ = uStack_cd0;
  auVar134._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar134._24_8_ = uStack_cc8;
  vpmulhrsw_avx2(auVar135,auVar134);
  uVar228 = piVar229[0x3b] << 3;
  uVar182 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar182),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar182),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_c90 = auVar232._0_8_;
  uStack_c88 = auVar232._8_8_;
  uVar228 = piVar229[5] << 3;
  uVar183 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar183),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar183),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_c50 = auVar231._0_8_;
  uStack_c48 = auVar231._8_8_;
  auVar133._8_8_ = uVar26;
  auVar133._0_8_ = uVar26;
  auVar133._16_8_ = uVar26;
  auVar133._24_8_ = uVar26;
  auVar132._16_8_ = uStack_c90;
  auVar132._0_16_ = auVar1;
  auVar132._24_8_ = uStack_c88;
  vpmulhrsw_avx2(auVar133,auVar132);
  auVar131._8_8_ = uVar26;
  auVar131._0_8_ = uVar26;
  auVar131._16_8_ = uVar26;
  auVar131._24_8_ = uVar26;
  auVar130._16_8_ = uStack_c50;
  auVar130._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar130._24_8_ = uStack_c48;
  vpmulhrsw_avx2(auVar131,auVar130);
  uVar184 = (short)piVar229[0x25] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar184),(uint)uVar184,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar184,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar184,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar184,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar184,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar184,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar184,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar184),(uint)uVar184,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar184,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar184,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar184,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar184,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar184,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar184,7);
  uStack_c10 = auVar232._0_8_;
  uStack_c08 = auVar232._8_8_;
  uVar228 = piVar229[0x1b] << 3;
  uVar235 = (undefined1)uVar228;
  cos_bit_00 = (int8_t)(uVar228 >> 8);
  auVar232 = vpinsrw_avx(ZEXT216((ushort)uVar228),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216((ushort)uVar228),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_bd0 = auVar231._0_8_;
  uStack_bc8 = auVar231._8_8_;
  auVar129._8_8_ = uVar33;
  auVar129._0_8_ = uVar33;
  auVar129._16_8_ = uVar33;
  auVar129._24_8_ = uVar33;
  auVar128._16_8_ = uStack_c10;
  auVar128._0_16_ = auVar1;
  auVar128._24_8_ = uStack_c08;
  vpmulhrsw_avx2(auVar129,auVar128);
  auVar127._8_8_ = uVar33;
  auVar127._0_8_ = uVar33;
  auVar127._16_8_ = uVar33;
  auVar127._24_8_ = uVar33;
  auVar126._16_8_ = uStack_bd0;
  auVar126._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar126._24_8_ = uStack_bc8;
  vpmulhrsw_avx2(auVar127,auVar126);
  uVar228 = piVar229[0x2b] << 3;
  uVar185 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar185),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar185),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_b90 = auVar232._0_8_;
  uStack_b88 = auVar232._8_8_;
  uVar228 = piVar229[0x15] << 3;
  uVar186 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar186),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar186),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_b50 = auVar231._0_8_;
  uStack_b48 = auVar231._8_8_;
  auVar125._8_8_ = uVar27;
  auVar125._0_8_ = uVar27;
  auVar125._16_8_ = uVar27;
  auVar125._24_8_ = uVar27;
  auVar124._16_8_ = uStack_b90;
  auVar124._0_16_ = auVar1;
  auVar124._24_8_ = uStack_b88;
  vpmulhrsw_avx2(auVar125,auVar124);
  auVar123._8_8_ = uVar27;
  auVar123._0_8_ = uVar27;
  auVar123._16_8_ = uVar27;
  auVar123._24_8_ = uVar27;
  auVar122._16_8_ = uStack_b50;
  auVar122._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar122._24_8_ = uStack_b48;
  vpmulhrsw_avx2(auVar123,auVar122);
  uVar187 = (short)piVar229[0x35] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar187),(uint)uVar187,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar187,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar187,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar187,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar187,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar187,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar187,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar187),(uint)uVar187,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar187,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar187,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar187,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar187,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar187,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar187,7);
  uStack_b10 = auVar232._0_8_;
  uStack_b08 = auVar232._8_8_;
  uVar228 = piVar229[0xb] << 3;
  uVar188 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar188),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar188),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_ad0 = auVar231._0_8_;
  uStack_ac8 = auVar231._8_8_;
  auVar121._8_8_ = uVar32;
  auVar121._0_8_ = uVar32;
  auVar121._16_8_ = uVar32;
  auVar121._24_8_ = uVar32;
  auVar120._16_8_ = uStack_b10;
  auVar120._0_16_ = auVar1;
  auVar120._24_8_ = uStack_b08;
  vpmulhrsw_avx2(auVar121,auVar120);
  auVar119._8_8_ = uVar32;
  auVar119._0_8_ = uVar32;
  auVar119._16_8_ = uVar32;
  auVar119._24_8_ = uVar32;
  auVar118._16_8_ = uStack_ad0;
  auVar118._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar118._24_8_ = uStack_ac8;
  vpmulhrsw_avx2(auVar119,auVar118);
  uVar228 = piVar229[0x33] << 3;
  uVar189 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar189),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar189),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_a90 = auVar232._0_8_;
  uStack_a88 = auVar232._8_8_;
  uVar228 = piVar229[0xd] << 3;
  uVar190 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar190),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar190),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_a50 = auVar231._0_8_;
  uStack_a48 = auVar231._8_8_;
  auVar117._8_8_ = uVar28;
  auVar117._0_8_ = uVar28;
  auVar117._16_8_ = uVar28;
  auVar117._24_8_ = uVar28;
  auVar116._16_8_ = uStack_a90;
  auVar116._0_16_ = auVar1;
  auVar116._24_8_ = uStack_a88;
  vpmulhrsw_avx2(auVar117,auVar116);
  auVar115._8_8_ = uVar28;
  auVar115._0_8_ = uVar28;
  auVar115._16_8_ = uVar28;
  auVar115._24_8_ = uVar28;
  auVar114._16_8_ = uStack_a50;
  auVar114._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar114._24_8_ = uStack_a48;
  vpmulhrsw_avx2(auVar115,auVar114);
  uVar191 = (short)piVar229[0x2d] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar191),(uint)uVar191,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar191,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar191,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar191,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar191,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar191,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar191,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar191),(uint)uVar191,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar191,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar191,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar191,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar191,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar191,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar191,7);
  uStack_a10 = auVar232._0_8_;
  uStack_a08 = auVar232._8_8_;
  uVar228 = piVar229[0x13] << 3;
  uVar192 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar192),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar192),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_9d0 = auVar231._0_8_;
  uStack_9c8 = auVar231._8_8_;
  auVar113._8_8_ = uVar31;
  auVar113._0_8_ = uVar31;
  auVar113._16_8_ = uVar31;
  auVar113._24_8_ = uVar31;
  auVar112._16_8_ = uStack_a10;
  auVar112._0_16_ = auVar1;
  auVar112._24_8_ = uStack_a08;
  vpmulhrsw_avx2(auVar113,auVar112);
  auVar111._8_8_ = uVar31;
  auVar111._0_8_ = uVar31;
  auVar111._16_8_ = uVar31;
  auVar111._24_8_ = uVar31;
  auVar110._16_8_ = uStack_9d0;
  auVar110._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar110._24_8_ = uStack_9c8;
  vpmulhrsw_avx2(auVar111,auVar110);
  uVar228 = piVar229[0x23] << 3;
  uVar193 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar193),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar193),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_990 = auVar232._0_8_;
  uStack_988 = auVar232._8_8_;
  uVar228 = piVar229[0x1d] << 3;
  uVar194 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar194),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar194),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_950 = auVar231._0_8_;
  uStack_948 = auVar231._8_8_;
  auVar109._8_8_ = uVar29;
  auVar109._0_8_ = uVar29;
  auVar109._16_8_ = uVar29;
  auVar109._24_8_ = uVar29;
  auVar108._16_8_ = uStack_990;
  auVar108._0_16_ = auVar1;
  auVar108._24_8_ = uStack_988;
  vpmulhrsw_avx2(auVar109,auVar108);
  auVar107._8_8_ = uVar29;
  auVar107._0_8_ = uVar29;
  auVar107._16_8_ = uVar29;
  auVar107._24_8_ = uVar29;
  auVar106._16_8_ = uStack_950;
  auVar106._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar106._24_8_ = uStack_948;
  vpmulhrsw_avx2(auVar107,auVar106);
  uVar195 = (short)piVar229[0x3d] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar195),(uint)uVar195,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar195,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar195,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar195,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar195,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar195,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar195,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar195),(uint)uVar195,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar195,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar195,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar195,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar195,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar195,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar195,7);
  uStack_910 = auVar232._0_8_;
  uStack_908 = auVar232._8_8_;
  uVar228 = piVar229[3] << 3;
  uVar196 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar196),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar196),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_8d0 = auVar231._0_8_;
  uStack_8c8 = auVar231._8_8_;
  auVar105._8_8_ = uVar30;
  auVar105._0_8_ = uVar30;
  auVar105._16_8_ = uVar30;
  auVar105._24_8_ = uVar30;
  auVar104._16_8_ = uStack_910;
  auVar104._0_16_ = auVar1;
  auVar104._24_8_ = uStack_908;
  vpmulhrsw_avx2(auVar105,auVar104);
  auVar103._8_8_ = uVar30;
  auVar103._0_8_ = uVar30;
  auVar103._16_8_ = uVar30;
  auVar103._24_8_ = uVar30;
  auVar102._16_8_ = uStack_8d0;
  auVar102._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar102._24_8_ = uStack_8c8;
  vpmulhrsw_avx2(auVar103,auVar102);
  uVar228 = piVar229[0x3e] << 3;
  uVar197 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar197),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar197),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_890 = auVar232._0_8_;
  uStack_888 = auVar232._8_8_;
  uVar228 = piVar229[2] << 3;
  uVar198 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar198),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar198),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_850 = auVar231._0_8_;
  uStack_848 = auVar231._8_8_;
  auVar101._8_8_ = uVar14;
  auVar101._0_8_ = uVar14;
  auVar101._16_8_ = uVar14;
  auVar101._24_8_ = uVar14;
  auVar100._16_8_ = uStack_890;
  auVar100._0_16_ = auVar1;
  auVar100._24_8_ = uStack_888;
  vpmulhrsw_avx2(auVar101,auVar100);
  auVar99._8_8_ = uVar14;
  auVar99._0_8_ = uVar14;
  auVar99._16_8_ = uVar14;
  auVar99._24_8_ = uVar14;
  auVar98._16_8_ = uStack_850;
  auVar98._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar98._24_8_ = uStack_848;
  vpmulhrsw_avx2(auVar99,auVar98);
  uVar199 = (short)piVar229[0x22] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar199),(uint)uVar199,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar199,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar199,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar199,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar199,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar199,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar199,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar199),(uint)uVar199,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar199,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar199,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar199,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar199,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar199,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar199,7);
  uStack_810 = auVar232._0_8_;
  uStack_808 = auVar232._8_8_;
  uVar228 = piVar229[0x1e] << 3;
  uVar234 = (undefined1)uVar228;
  cos_bit = (int8_t)(uVar228 >> 8);
  auVar232 = vpinsrw_avx(ZEXT216((ushort)uVar228),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216((ushort)uVar228),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_7d0 = auVar231._0_8_;
  uStack_7c8 = auVar231._8_8_;
  auVar97._8_8_ = uVar21;
  auVar97._0_8_ = uVar21;
  auVar97._16_8_ = uVar21;
  auVar97._24_8_ = uVar21;
  auVar96._16_8_ = uStack_810;
  auVar96._0_16_ = auVar1;
  auVar96._24_8_ = uStack_808;
  vpmulhrsw_avx2(auVar97,auVar96);
  auVar95._8_8_ = uVar21;
  auVar95._0_8_ = uVar21;
  auVar95._16_8_ = uVar21;
  auVar95._24_8_ = uVar21;
  auVar94._16_8_ = uStack_7d0;
  auVar94._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar94._24_8_ = uStack_7c8;
  vpmulhrsw_avx2(auVar95,auVar94);
  uVar228 = piVar229[0x2e] << 3;
  uVar200 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar200),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar200),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_790 = auVar232._0_8_;
  uStack_788 = auVar232._8_8_;
  uVar228 = piVar229[0x12] << 3;
  uVar201 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar201),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar201),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_750 = auVar231._0_8_;
  uStack_748 = auVar231._8_8_;
  auVar93._8_8_ = uVar15;
  auVar93._0_8_ = uVar15;
  auVar93._16_8_ = uVar15;
  auVar93._24_8_ = uVar15;
  auVar92._16_8_ = uStack_790;
  auVar92._0_16_ = auVar1;
  auVar92._24_8_ = uStack_788;
  vpmulhrsw_avx2(auVar93,auVar92);
  auVar91._8_8_ = uVar15;
  auVar91._0_8_ = uVar15;
  auVar91._16_8_ = uVar15;
  auVar91._24_8_ = uVar15;
  auVar90._16_8_ = uStack_750;
  auVar90._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar90._24_8_ = uStack_748;
  vpmulhrsw_avx2(auVar91,auVar90);
  uVar202 = (short)piVar229[0x32] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar202),(uint)uVar202,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar202,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar202,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar202,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar202,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar202,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar202,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar202),(uint)uVar202,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar202,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar202,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar202,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar202,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar202,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar202,7);
  uStack_710 = auVar232._0_8_;
  uStack_708 = auVar232._8_8_;
  uVar228 = piVar229[0xe] << 3;
  uVar203 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar203),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar203),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_6d0 = auVar231._0_8_;
  uStack_6c8 = auVar231._8_8_;
  auVar89._8_8_ = uVar20;
  auVar89._0_8_ = uVar20;
  auVar89._16_8_ = uVar20;
  auVar89._24_8_ = uVar20;
  auVar88._16_8_ = uStack_710;
  auVar88._0_16_ = auVar1;
  auVar88._24_8_ = uStack_708;
  vpmulhrsw_avx2(auVar89,auVar88);
  auVar87._8_8_ = uVar20;
  auVar87._0_8_ = uVar20;
  auVar87._16_8_ = uVar20;
  auVar87._24_8_ = uVar20;
  auVar86._16_8_ = uStack_6d0;
  auVar86._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar86._24_8_ = uStack_6c8;
  vpmulhrsw_avx2(auVar87,auVar86);
  uVar228 = piVar229[0x36] << 3;
  uVar204 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar204),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar204),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_690 = auVar232._0_8_;
  uStack_688 = auVar232._8_8_;
  uVar228 = piVar229[10] << 3;
  uVar205 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar205),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar205),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_650 = auVar231._0_8_;
  uStack_648 = auVar231._8_8_;
  auVar85._8_8_ = uVar16;
  auVar85._0_8_ = uVar16;
  auVar85._16_8_ = uVar16;
  auVar85._24_8_ = uVar16;
  auVar84._16_8_ = uStack_690;
  auVar84._0_16_ = auVar1;
  auVar84._24_8_ = uStack_688;
  vpmulhrsw_avx2(auVar85,auVar84);
  auVar83._8_8_ = uVar16;
  auVar83._0_8_ = uVar16;
  auVar83._16_8_ = uVar16;
  auVar83._24_8_ = uVar16;
  auVar82._16_8_ = uStack_650;
  auVar82._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar82._24_8_ = uStack_648;
  vpmulhrsw_avx2(auVar83,auVar82);
  uVar206 = (short)piVar229[0x2a] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar206),(uint)uVar206,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar206,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar206,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar206,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar206,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar206,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar206,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar206),(uint)uVar206,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar206,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar206,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar206,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar206,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar206,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar206,7);
  uStack_610 = auVar232._0_8_;
  uStack_608 = auVar232._8_8_;
  uVar228 = piVar229[0x16] << 3;
  uVar207 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar207),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar207),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_5d0 = auVar231._0_8_;
  uStack_5c8 = auVar231._8_8_;
  auVar81._8_8_ = uVar19;
  auVar81._0_8_ = uVar19;
  auVar81._16_8_ = uVar19;
  auVar81._24_8_ = uVar19;
  auVar80._16_8_ = uStack_610;
  auVar80._0_16_ = auVar1;
  auVar80._24_8_ = uStack_608;
  vpmulhrsw_avx2(auVar81,auVar80);
  auVar79._8_8_ = uVar19;
  auVar79._0_8_ = uVar19;
  auVar79._16_8_ = uVar19;
  auVar79._24_8_ = uVar19;
  auVar78._16_8_ = uStack_5d0;
  auVar78._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar78._24_8_ = uStack_5c8;
  vpmulhrsw_avx2(auVar79,auVar78);
  uVar228 = piVar229[0x26] << 3;
  uVar208 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar208),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar208),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_590 = auVar232._0_8_;
  uStack_588 = auVar232._8_8_;
  uVar228 = piVar229[0x1a] << 3;
  uVar209 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar209),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar209),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_550 = auVar231._0_8_;
  uStack_548 = auVar231._8_8_;
  auVar77._8_8_ = uVar17;
  auVar77._0_8_ = uVar17;
  auVar77._16_8_ = uVar17;
  auVar77._24_8_ = uVar17;
  auVar76._16_8_ = uStack_590;
  auVar76._0_16_ = auVar1;
  auVar76._24_8_ = uStack_588;
  vpmulhrsw_avx2(auVar77,auVar76);
  auVar75._8_8_ = uVar17;
  auVar75._0_8_ = uVar17;
  auVar75._16_8_ = uVar17;
  auVar75._24_8_ = uVar17;
  auVar74._16_8_ = uStack_550;
  auVar74._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar74._24_8_ = uStack_548;
  vpmulhrsw_avx2(auVar75,auVar74);
  uVar210 = (short)piVar229[0x3a] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar210),(uint)uVar210,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar210,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar210,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar210,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar210,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar210,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar210,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar210),(uint)uVar210,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar210,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar210,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar210,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar210,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar210,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar210,7);
  uStack_510 = auVar232._0_8_;
  uStack_508 = auVar232._8_8_;
  uVar228 = piVar229[6] << 3;
  uVar211 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar211),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar211),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_4d0 = auVar231._0_8_;
  uStack_4c8 = auVar231._8_8_;
  auVar73._8_8_ = uVar18;
  auVar73._0_8_ = uVar18;
  auVar73._16_8_ = uVar18;
  auVar73._24_8_ = uVar18;
  auVar72._16_8_ = uStack_510;
  auVar72._0_16_ = auVar1;
  auVar72._24_8_ = uStack_508;
  vpmulhrsw_avx2(auVar73,auVar72);
  auVar71._8_8_ = uVar18;
  auVar71._0_8_ = uVar18;
  auVar71._16_8_ = uVar18;
  auVar71._24_8_ = uVar18;
  auVar70._16_8_ = uStack_4d0;
  auVar70._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar70._24_8_ = uStack_4c8;
  vpmulhrsw_avx2(auVar71,auVar70);
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  uVar228 = piVar229[0x3c] << 3;
  uVar212 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar212),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar212),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_490 = auVar232._0_8_;
  uStack_488 = auVar232._8_8_;
  uVar228 = piVar229[4] << 3;
  uVar213 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar213),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar213),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_450 = auVar231._0_8_;
  uStack_448 = auVar231._8_8_;
  auVar69._8_8_ = uVar8;
  auVar69._0_8_ = uVar8;
  auVar69._16_8_ = uVar8;
  auVar69._24_8_ = uVar9;
  auVar68._16_8_ = uStack_490;
  auVar68._0_16_ = auVar1;
  auVar68._24_8_ = uStack_488;
  vpmulhrsw_avx2(auVar69,auVar68);
  auVar67._8_8_ = uVar8;
  auVar67._0_8_ = uVar8;
  auVar67._16_8_ = uVar8;
  auVar67._24_8_ = uVar9;
  auVar66._16_8_ = uStack_450;
  auVar66._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar66._24_8_ = uStack_448;
  vpmulhrsw_avx2(auVar67,auVar66);
  uVar214 = (short)piVar229[0x24] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar214),(uint)uVar214,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar214,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar214,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar214,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar214,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar214,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar214,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar214),(uint)uVar214,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar214,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar214,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar214,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar214,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar214,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar214,7);
  uStack_410 = auVar232._0_8_;
  uStack_408 = auVar232._8_8_;
  uVar228 = piVar229[0x1c] << 3;
  uVar215 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar215),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar215),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_3d0 = auVar231._0_8_;
  uStack_3c8 = auVar231._8_8_;
  auVar65._8_8_ = uVar12;
  auVar65._0_8_ = uVar12;
  auVar65._16_8_ = uVar12;
  auVar65._24_8_ = uVar13;
  auVar64._16_8_ = uStack_410;
  auVar64._0_16_ = auVar1;
  auVar64._24_8_ = uStack_408;
  vpmulhrsw_avx2(auVar65,auVar64);
  auVar63._8_8_ = uVar12;
  auVar63._0_8_ = uVar12;
  auVar63._16_8_ = uVar12;
  auVar63._24_8_ = uVar13;
  auVar62._16_8_ = uStack_3d0;
  auVar62._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar62._24_8_ = uStack_3c8;
  vpmulhrsw_avx2(auVar63,auVar62);
  uVar228 = piVar229[0x2c] << 3;
  uVar216 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar216),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar216),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_390 = auVar232._0_8_;
  uStack_388 = auVar232._8_8_;
  uVar228 = piVar229[0x14] << 3;
  uVar217 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar217),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar217),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_350 = auVar231._0_8_;
  uStack_348 = auVar231._8_8_;
  auVar61._8_8_ = uVar10;
  auVar61._0_8_ = uVar10;
  auVar61._16_8_ = uVar10;
  auVar61._24_8_ = uVar11;
  auVar60._16_8_ = uStack_390;
  auVar60._0_16_ = auVar1;
  auVar60._24_8_ = uStack_388;
  vpmulhrsw_avx2(auVar61,auVar60);
  auVar59._8_8_ = uVar10;
  auVar59._0_8_ = uVar10;
  auVar59._16_8_ = uVar10;
  auVar59._24_8_ = uVar11;
  auVar58._16_8_ = uStack_350;
  auVar58._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar58._24_8_ = uStack_348;
  vpmulhrsw_avx2(auVar59,auVar58);
  uVar218 = (short)piVar229[0x34] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar218),(uint)uVar218,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar218,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar218,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar218,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar218,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar218,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar218,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar218),(uint)uVar218,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar218,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar218,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar218,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar218,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar218,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar218,7);
  uStack_310 = auVar232._0_8_;
  uStack_308 = auVar232._8_8_;
  uVar228 = piVar229[0xc] << 3;
  uVar219 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar219),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar219),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar231 = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar232 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  lStack_2d0 = auVar232._0_8_;
  uStack_2c8 = auVar232._8_8_;
  auVar57._8_8_ = lVar239;
  auVar57._0_8_ = lVar239;
  auVar57._16_8_ = lVar239;
  auVar57._24_8_ = uVar242;
  auVar56._16_8_ = uStack_310;
  auVar56._0_16_ = auVar1;
  auVar56._24_8_ = uStack_308;
  vpmulhrsw_avx2(auVar57,auVar56);
  auVar55._8_8_ = lVar239;
  auVar55._0_8_ = lVar239;
  auVar55._16_8_ = lVar239;
  auVar55._24_8_ = uVar242;
  auVar54._16_8_ = lStack_2d0;
  auVar54._0_16_ = auVar231;
  auVar54._24_8_ = uStack_2c8;
  vpmulhrsw_avx2(auVar55,auVar54);
  lVar240 = lVar239;
  lVar241 = lVar239;
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  _r_06[1] = in_stack_ffffffffffffcb00;
  _r_06[0] = in_stack_ffffffffffffcaf8;
  _r_06[2] = in_stack_ffffffffffffcb08;
  _r_06[3] = in_stack_ffffffffffffcb10;
  idct64_stage4_high32_avx2(in_stack_ffffffffffffcb20,in_stack_ffffffffffffcb18,_r_06,cos_bit_02);
  uVar228 = piVar229[0x38] << 3;
  uVar220 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar220),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar220),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  palStack_298 = auVar1._8_8_;
  palStack_290 = auVar232._0_8_;
  uStack_288 = auVar232._8_8_;
  uVar228 = piVar229[8] << 3;
  uVar221 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar221),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar221),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar230 = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar232 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  lStack_250 = auVar232._0_8_;
  uStack_248 = auVar232._8_8_;
  auVar53._8_8_ = uVar237;
  auVar53._0_8_ = uVar237;
  auVar53._16_8_ = uVar237;
  auVar53._24_8_ = uVar238;
  auVar52._16_8_ = palStack_290;
  auVar52._0_16_ = auVar1;
  auVar52._24_8_ = uStack_288;
  vpmulhrsw_avx2(auVar53,auVar52);
  auVar51._8_8_ = uVar237;
  auVar51._0_8_ = uVar237;
  auVar51._16_8_ = uVar237;
  auVar51._24_8_ = uVar238;
  auVar50._16_8_ = lStack_250;
  auVar50._0_16_ = auVar230;
  auVar50._24_8_ = uStack_248;
  vpmulhrsw_avx2(auVar51,auVar50);
  uVar222 = (short)piVar229[0x28] * -8;
  auVar1 = vpinsrw_avx(ZEXT216(uVar222),(uint)uVar222,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar222,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar222,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar222,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar222,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar222,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar222,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar222),(uint)uVar222,1);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar222,2);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar222,3);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar222,4);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar222,5);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar222,6);
  auVar232 = vpinsrw_avx(auVar232,(uint)uVar222,7);
  uStack_210 = auVar232._0_8_;
  uStack_208 = auVar232._8_8_;
  uVar228 = piVar229[0x18] << 3;
  uVar223 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar223),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar223),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar233 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_1d0 = auVar233._0_8_;
  uStack_1c8 = auVar233._8_8_;
  auVar49._8_8_ = uVar6;
  auVar49._0_8_ = uVar6;
  auVar49._16_8_ = uVar6;
  auVar49._24_8_ = uVar7;
  auVar48._16_8_ = uStack_210;
  auVar48._0_16_ = auVar1;
  auVar48._24_8_ = uStack_208;
  vpmulhrsw_avx2(auVar49,auVar48);
  auVar47._8_8_ = uVar6;
  auVar47._0_8_ = uVar6;
  auVar47._16_8_ = uVar6;
  auVar47._24_8_ = uVar7;
  auVar46._16_8_ = uStack_1d0;
  auVar46._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar46._24_8_ = uStack_1c8;
  vpmulhrsw_avx2(auVar47,auVar46);
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  cos_bit_03 = (int32_t)((ulong)uVar237 >> 0x20);
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  _r_05[1] = in_stack_ffffffffffffca40;
  _r_05[0] = in_stack_ffffffffffffca38;
  _r_05[2] = in_stack_ffffffffffffca48;
  _r_05[3] = in_stack_ffffffffffffca50;
  idct64_stage5_high48_avx2(in_stack_ffffffffffffca60,in_stack_ffffffffffffca58,_r_05,cos_bit_01);
  uVar228 = piVar229[0x20] << 3;
  uVar224 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar224),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar224),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_190 = auVar232._0_8_;
  uStack_188 = auVar232._8_8_;
  uVar228 = piVar229[0x20] << 3;
  uVar225 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar225),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar225),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar233 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_150 = auVar233._0_8_;
  uStack_148 = auVar233._8_8_;
  auVar45._8_8_ = uVar3;
  auVar45._0_8_ = uVar3;
  auVar45._16_8_ = uVar3;
  auVar45._24_8_ = uVar4;
  auVar44._16_8_ = uStack_190;
  auVar44._0_16_ = auVar1;
  auVar44._24_8_ = uStack_188;
  vpmulhrsw_avx2(auVar45,auVar44);
  auVar43._8_8_ = uVar3;
  auVar43._0_8_ = uVar3;
  auVar43._16_8_ = uVar3;
  auVar43._24_8_ = uVar4;
  auVar42._16_8_ = uStack_150;
  auVar42._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar42._24_8_ = uStack_148;
  vpmulhrsw_avx2(auVar43,auVar42);
  uVar228 = piVar229[0x30] << 3;
  uVar226 = (ushort)uVar228;
  auVar1 = vpinsrw_avx(ZEXT216(uVar226),uVar228 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar228 & 0xffff,7);
  auVar232 = vpinsrw_avx(ZEXT216(uVar226),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  uStack_110 = auVar232._0_8_;
  uStack_108 = auVar232._8_8_;
  uVar228 = piVar229[0x10] << 3;
  uVar227 = (ushort)uVar228;
  auVar232 = vpinsrw_avx(ZEXT216(uVar227),uVar228 & 0xffff,1);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,2);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,3);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,4);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,5);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,6);
  auVar232 = vpinsrw_avx(auVar232,uVar228 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar227),uVar228 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar228 & 0xffff,7);
  auVar233 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar232;
  uStack_d0 = auVar233._0_8_;
  uStack_c8 = auVar233._8_8_;
  auVar41._8_8_ = x_00;
  auVar41._0_8_ = x_00;
  auVar41._16_8_ = x_00;
  auVar41._24_8_ = uVar5;
  auVar40._16_8_ = uStack_110;
  auVar40._0_16_ = auVar1;
  auVar40._24_8_ = uStack_108;
  vpmulhrsw_avx2(auVar41,auVar40);
  auVar39._8_8_ = x_00;
  auVar39._0_8_ = x_00;
  auVar39._16_8_ = x_00;
  auVar39._24_8_ = uVar5;
  auVar38._16_8_ = uStack_d0;
  auVar38._0_16_ = ZEXT116(0) * auVar232 + ZEXT116(1) * auVar2;
  auVar38._24_8_ = uStack_c8;
  vpmulhrsw_avx2(auVar39,auVar38);
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  w0[1] = auVar231._0_8_;
  w0[0] = uVar242;
  w0[2] = auVar231._8_8_;
  w0[3] = lStack_2d0;
  w1[1] = lVar239;
  w1[0] = uStack_288;
  w1[2] = lVar240;
  w1[3] = lVar241;
  _r_07[1] = auVar230._0_8_;
  _r_07[0] = uVar238;
  _r_07[2] = auVar230._8_8_;
  _r_07[3] = lStack_250;
  btf_16_w16_avx2(w0,w1,palStack_290,palStack_298,_r_07,cos_bit_03);
  w0_00[1] = auVar231._0_8_;
  w0_00[0] = uVar242;
  w0_00[2] = auVar231._8_8_;
  w0_00[3] = lStack_2d0;
  w1_00[1] = lVar239;
  w1_00[0] = uStack_288;
  w1_00[2] = lVar240;
  w1_00[3] = lVar241;
  _r_08[1] = auVar230._0_8_;
  _r_08[0] = uVar238;
  _r_08[2] = auVar230._8_8_;
  _r_08[3] = lStack_250;
  btf_16_w16_avx2(w0_00,w1_00,palStack_290,palStack_298,_r_08,cos_bit_03);
  _r_00[0]._4_2_ = uVar226;
  _r_00[0]._0_4_ = in_stack_ffffffffffffc978;
  _r_00[0]._6_2_ = uVar227;
  _r_00[1]._0_2_ = uVar224;
  _r_00[1]._2_2_ = uVar225;
  _r_00[1]._4_2_ = uVar222;
  _r_00[1]._6_2_ = uVar223;
  _r_00[2]._0_2_ = uVar220;
  _r_00[2]._2_2_ = uVar221;
  _r_00[2]._4_2_ = uVar218;
  _r_00[2]._6_2_ = uVar219;
  _r_00[3]._0_2_ = uVar216;
  _r_00[3]._2_2_ = uVar217;
  _r_00[3]._4_2_ = uVar214;
  _r_00[3]._6_2_ = uVar215;
  idct64_stage6_high48_avx2
            ((__m256i *)CONCAT26(uVar207,CONCAT24(uVar206,CONCAT22(uVar209,uVar208))),
             (int32_t *)CONCAT26(uVar211,CONCAT24(uVar210,CONCAT22(uVar213,uVar212))),_r_00,
             in_stack_ffffffffffffc977);
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  w0_01[1] = auVar231._0_8_;
  w0_01[0] = uVar242;
  w0_01[2] = auVar231._8_8_;
  w0_01[3] = lStack_2d0;
  w1_01[1] = lVar239;
  w1_01[0] = uStack_288;
  w1_01[2] = lVar240;
  w1_01[3] = lVar241;
  _r_09[1] = auVar230._0_8_;
  _r_09[0] = uVar238;
  _r_09[2] = auVar230._8_8_;
  _r_09[3] = lStack_250;
  btf_16_w16_avx2(w0_01,w1_01,palStack_290,palStack_298,_r_09,cos_bit_03);
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  _r_03[0]._2_2_ = uVar183;
  _r_03[0]._0_2_ = uVar182;
  _r_03[0]._4_2_ = uVar180;
  _r_03[0]._6_2_ = uVar181;
  _r_03[1]._0_2_ = uVar178;
  _r_03[1]._2_2_ = uVar179;
  _r_03[1]._4_2_ = uVar176;
  _r_03[1]._6_2_ = uVar177;
  _r_03[2]._0_2_ = uVar174;
  _r_03[2]._2_2_ = uVar175;
  _r_03[2]._4_2_ = uVar172;
  _r_03[2]._6_2_ = uVar173;
  _r_03[3]._0_2_ = uVar170;
  _r_03[3]._2_2_ = uVar171;
  _r_03[3]._4_2_ = uVar168;
  _r_03[3]._6_2_ = uVar169;
  idct64_stage7_high48_avx2
            (x_00,(int32_t *)CONCAT44(uVar236,CONCAT22(uVar167,uVar166)),_r_03,cos_bit_00);
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  btf_16_adds_subs_avx2
            ((__m256i *)
             CONCAT17(cos_bit,CONCAT16(uVar234,CONCAT24(uVar199,CONCAT22(uVar201,uVar200)))),
             (__m256i *)CONCAT26(uVar203,CONCAT24(uVar202,CONCAT22(uVar205,uVar204))));
  w0_02[1] = auVar231._0_8_;
  w0_02[0] = uVar242;
  w0_02[2] = auVar231._8_8_;
  w0_02[3] = lStack_2d0;
  w1_02[1] = lVar239;
  w1_02[0] = uStack_288;
  w1_02[2] = lVar240;
  w1_02[3] = lVar241;
  _r_10[1] = auVar230._0_8_;
  _r_10[0] = uVar238;
  _r_10[2] = auVar230._8_8_;
  _r_10[3] = lStack_250;
  btf_16_w16_avx2(w0_02,w1_02,palStack_290,palStack_298,_r_10,cos_bit_03);
  w0_03[1] = auVar231._0_8_;
  w0_03[0] = uVar242;
  w0_03[2] = auVar231._8_8_;
  w0_03[3] = lStack_2d0;
  w1_03[1] = lVar239;
  w1_03[0] = uStack_288;
  w1_03[2] = lVar240;
  w1_03[3] = lVar241;
  _r_11[1] = auVar230._0_8_;
  _r_11[0] = uVar238;
  _r_11[2] = auVar230._8_8_;
  _r_11[3] = lStack_250;
  btf_16_w16_avx2(w0_03,w1_03,palStack_290,palStack_298,_r_11,cos_bit_03);
  _r_04[0]._2_2_ = uVar183;
  _r_04[0]._0_2_ = uVar182;
  _r_04[0]._4_2_ = uVar180;
  _r_04[0]._6_2_ = uVar181;
  _r_04[1]._0_2_ = uVar178;
  _r_04[1]._2_2_ = uVar179;
  _r_04[1]._4_2_ = uVar176;
  _r_04[1]._6_2_ = uVar177;
  _r_04[2]._0_2_ = uVar174;
  _r_04[2]._2_2_ = uVar175;
  _r_04[2]._4_2_ = uVar172;
  _r_04[2]._6_2_ = uVar173;
  _r_04[3]._0_2_ = uVar170;
  _r_04[3]._2_2_ = uVar171;
  _r_04[3]._4_2_ = uVar168;
  _r_04[3]._6_2_ = uVar169;
  idct64_stage8_high48_avx2
            (x_00,(int32_t *)CONCAT44(uVar236,CONCAT22(uVar167,uVar166)),_r_04,cos_bit_00);
  _r_01[0]._2_2_ = uVar198;
  _r_01[0]._0_2_ = uVar197;
  _r_01[0]._4_2_ = uVar195;
  _r_01[0]._6_2_ = uVar196;
  _r_01[1]._0_2_ = uVar193;
  _r_01[1]._2_2_ = uVar194;
  _r_01[1]._4_2_ = uVar191;
  _r_01[1]._6_2_ = uVar192;
  _r_01[2]._0_2_ = uVar189;
  _r_01[2]._2_2_ = uVar190;
  _r_01[2]._4_2_ = uVar187;
  _r_01[2]._6_2_ = uVar188;
  _r_01[3]._0_2_ = uVar185;
  _r_01[3]._2_2_ = uVar186;
  _r_01[3]._4_2_ = uVar184;
  _r_01[3]._6_1_ = uVar235;
  _r_01[3]._7_1_ = cos_bit_00;
  idct64_stage9_avx2((__m256i *)CONCAT26(uVar177,CONCAT24(uVar176,CONCAT22(uVar179,uVar178))),
                     (int32_t *)CONCAT26(uVar181,CONCAT24(uVar180,CONCAT22(uVar183,uVar182))),_r_01,
                     cos_bit);
  _r_02[0]._2_2_ = uVar198;
  _r_02[0]._0_2_ = uVar197;
  _r_02[0]._4_2_ = uVar195;
  _r_02[0]._6_2_ = uVar196;
  _r_02[1]._0_2_ = uVar193;
  _r_02[1]._2_2_ = uVar194;
  _r_02[1]._4_2_ = uVar191;
  _r_02[1]._6_2_ = uVar192;
  _r_02[2]._0_2_ = uVar189;
  _r_02[2]._2_2_ = uVar190;
  _r_02[2]._4_2_ = uVar187;
  _r_02[2]._6_2_ = uVar188;
  _r_02[3]._0_2_ = uVar185;
  _r_02[3]._2_2_ = uVar186;
  _r_02[3]._4_2_ = uVar184;
  _r_02[3]._6_1_ = uVar235;
  _r_02[3]._7_1_ = cos_bit_00;
  idct64_stage10_avx2((__m256i *)CONCAT26(uVar177,CONCAT24(uVar176,CONCAT22(uVar179,uVar178))),
                      (int32_t *)CONCAT26(uVar181,CONCAT24(uVar180,CONCAT22(uVar183,uVar182))),_r_02
                      ,cos_bit);
  idct64_stage11_avx2(in_stack_ffffffffffffc968,in_stack_ffffffffffffc960);
  return;
}

Assistant:

static void idct64_low32_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m256i x[64];
  x[0] = input[0];
  x[2] = input[16];
  x[4] = input[8];
  x[6] = input[24];
  x[8] = input[4];
  x[10] = input[20];
  x[12] = input[12];
  x[14] = input[28];
  x[16] = input[2];
  x[18] = input[18];
  x[20] = input[10];
  x[22] = input[26];
  x[24] = input[6];
  x[26] = input[22];
  x[28] = input[14];
  x[30] = input[30];
  x[32] = input[1];
  x[34] = input[17];
  x[36] = input[9];
  x[38] = input[25];
  x[40] = input[5];
  x[42] = input[21];
  x[44] = input[13];
  x[46] = input[29];
  x[48] = input[3];
  x[50] = input[19];
  x[52] = input[11];
  x[54] = input[27];
  x[56] = input[7];
  x[58] = input[23];
  x[60] = input[15];
  x[62] = input[31];

  // stage 2
  btf_16_w16_0_avx2(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_w16_0_avx2(-cospi[33], cospi[31], x[62], x[33], x[62]);
  btf_16_w16_0_avx2(cospi[47], cospi[17], x[34], x[34], x[61]);
  btf_16_w16_0_avx2(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_w16_0_avx2(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_w16_0_avx2(-cospi[41], cospi[23], x[58], x[37], x[58]);
  btf_16_w16_0_avx2(cospi[39], cospi[25], x[38], x[38], x[57]);
  btf_16_w16_0_avx2(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_w16_0_avx2(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_w16_0_avx2(-cospi[37], cospi[27], x[54], x[41], x[54]);
  btf_16_w16_0_avx2(cospi[43], cospi[21], x[42], x[42], x[53]);
  btf_16_w16_0_avx2(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_w16_0_avx2(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_w16_0_avx2(-cospi[45], cospi[19], x[50], x[45], x[50]);
  btf_16_w16_0_avx2(cospi[35], cospi[29], x[46], x[46], x[49]);
  btf_16_w16_0_avx2(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_w16_0_avx2(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_w16_0_avx2(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);
  btf_16_adds_subs_avx2(&x[32], &x[33]);
  btf_16_adds_subs_avx2(&x[35], &x[34]);
  btf_16_adds_subs_avx2(&x[36], &x[37]);
  btf_16_adds_subs_avx2(&x[39], &x[38]);
  btf_16_adds_subs_avx2(&x[40], &x[41]);
  btf_16_adds_subs_avx2(&x[43], &x[42]);
  btf_16_adds_subs_avx2(&x[44], &x[45]);
  btf_16_adds_subs_avx2(&x[47], &x[46]);
  btf_16_adds_subs_avx2(&x[48], &x[49]);
  btf_16_adds_subs_avx2(&x[51], &x[50]);
  btf_16_adds_subs_avx2(&x[52], &x[53]);
  btf_16_adds_subs_avx2(&x[55], &x[54]);
  btf_16_adds_subs_avx2(&x[56], &x[57]);
  btf_16_adds_subs_avx2(&x[59], &x[58]);
  btf_16_adds_subs_avx2(&x[60], &x[61]);
  btf_16_adds_subs_avx2(&x[63], &x[62]);

  // stage 4
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_w16_0_avx2(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  btf_16_adds_subs_avx2(&x[16], &x[17]);
  btf_16_adds_subs_avx2(&x[19], &x[18]);
  btf_16_adds_subs_avx2(&x[20], &x[21]);
  btf_16_adds_subs_avx2(&x[23], &x[22]);
  btf_16_adds_subs_avx2(&x[24], &x[25]);
  btf_16_adds_subs_avx2(&x[27], &x[26]);
  btf_16_adds_subs_avx2(&x[28], &x[29]);
  btf_16_adds_subs_avx2(&x[31], &x[30]);
  idct64_stage4_high32_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_w16_0_avx2(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_avx2(&x[8], &x[9]);
  btf_16_adds_subs_avx2(&x[11], &x[10]);
  btf_16_adds_subs_avx2(&x[12], &x[13]);
  btf_16_adds_subs_avx2(&x[15], &x[14]);
  idct64_stage5_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_w16_0_avx2(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_avx2(&x[4], &x[5]);
  btf_16_adds_subs_avx2(&x[7], &x[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[10], &x[13], _r,
                  INV_COS_BIT);
  idct64_stage6_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 7
  btf_16_adds_subs_avx2(&x[0], &x[3]);
  btf_16_adds_subs_avx2(&x[1], &x[2]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[5], &x[6], _r, INV_COS_BIT);
  btf_16_adds_subs_avx2(&x[8], &x[11]);
  btf_16_adds_subs_avx2(&x[9], &x[10]);
  btf_16_adds_subs_avx2(&x[15], &x[12]);
  btf_16_adds_subs_avx2(&x[14], &x[13]);
  idct64_stage7_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 8
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r,
                  INV_COS_BIT);
  idct64_stage8_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 9~11
  idct64_stage9_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage10_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage11_avx2(output, x);
}